

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

FString __thiscall input_mod::GetStats(input_mod *this)

{
  IT_PLAYING *pIVar1;
  DUMB_IT_SIGRENDERER *pDVar2;
  DUMB_IT_SIGDATA *pDVar3;
  char *pcVar4;
  long in_RSI;
  uint local_a4;
  int local_64;
  int i_1;
  IT_PLAYING *playing;
  int local_50;
  int i;
  int channels;
  DUMB_IT_SIGDATA *itsd;
  DUMB_IT_SIGRENDERER *itsr;
  input_mod *this_local;
  FString *out;
  
  pDVar2 = duh_get_it_sigrenderer((DUH_SIGRENDERER *)0x411e89);
  pDVar3 = duh_get_it_sigdata((DUH *)0x411e9d);
  FString::FString((FString *)this);
  local_50 = 0;
  for (playing._4_4_ = 0; playing._4_4_ < 0x40; playing._4_4_ = playing._4_4_ + 1) {
    pIVar1 = pDVar2->channel[playing._4_4_].playing;
    if ((pIVar1 != (IT_PLAYING *)0x0) && ((pIVar1->flags & 8U) == 0)) {
      local_50 = local_50 + 1;
    }
  }
  for (local_64 = 0; local_64 < 0xc0; local_64 = local_64 + 1) {
    if (pDVar2->playing[local_64] != (IT_PLAYING *)0x0) {
      local_50 = local_50 + 1;
    }
  }
  if ((pDVar2 == (DUMB_IT_SIGRENDERER *)0x0) || (pDVar3 == (DUMB_IT_SIGDATA *)0x0)) {
    FString::operator=((FString *)this,"Problem getting stats");
  }
  else {
    pcVar4 = FString::GetChars((FString *)(in_RSI + 0x18));
    if ((pDVar3->order == (uchar *)0x0) || (pDVar3->n_orders <= pDVar2->order)) {
      local_a4 = 0;
    }
    else {
      local_a4 = (uint)pDVar3->order[pDVar2->order];
    }
    FString::Format((FString *)this,
                    "%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
                    pcVar4,(ulong)(uint)pDVar2->order,(ulong)*(uint *)(in_RSI + 0x38),
                    (ulong)local_a4,*(undefined4 *)(in_RSI + 0x34),pDVar2->row,pDVar2->n_rows,
                    local_50,*(undefined4 *)(in_RSI + 0x30),pDVar2->speed,pDVar2->tempo);
  }
  return (FString)(char *)this;
}

Assistant:

FString input_mod::GetStats()
{
	//return StreamSong::GetStats();
	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	DUMB_IT_SIGDATA *itsd = duh_get_it_sigdata(duh);
	FString out;

	int channels = 0;
	for (int i = 0; i < DUMB_IT_N_CHANNELS; i++)
	{
		IT_PLAYING * playing = itsr->channel[i].playing;
		if (playing && !(playing->flags & IT_PLAYING_DEAD)) channels++;
	}
	for (int i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
	{
		if (itsr->playing[i]) channels++;
	}

	if (itsr == NULL || itsd == NULL)
	{
		out = "Problem getting stats";
	}
	else
	{
		out.Format("%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
			Codec.GetChars(),
			itsr->order, NumOrders,
			(itsd->order && itsr->order < itsd->n_orders ? itsd->order[itsr->order] : 0), NumPatterns,
			itsr->row, itsr->n_rows,
			channels, NumChannels,
			itsr->speed,
			itsr->tempo
			);
	}
	return out;
}